

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::LookUpEnumValue
          (internal *this,EnumEntry *enums,size_t size,string_view name,int *value)

{
  internal *piVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  ulong __n_00;
  difference_type __d;
  EnumEntry *pEVar4;
  long lVar5;
  
  piVar1 = this + (long)enums * 0x18;
  if (0 < (long)enums) {
    do {
      pEVar4 = (EnumEntry *)((ulong)enums >> 1);
      __n_00 = *(ulong *)(this + (long)pEVar4 * 0x18);
      lVar5 = __n_00 - size;
      if (size <= __n_00) {
        __n_00 = size;
      }
      if (__n_00 == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = memcmp(*(void **)(this + (long)pEVar4 * 0x18 + 8),(void *)name._M_len,__n_00);
      }
      if (iVar3 == 0) {
        if (lVar5 < -0x7fffffff) {
          lVar5 = -0x80000000;
        }
        if (0x7ffffffe < lVar5) {
          lVar5 = 0x7fffffff;
        }
        iVar3 = (int)lVar5;
      }
      if (iVar3 < 0) {
        this = this + (long)pEVar4 * 0x18 + 0x18;
        pEVar4 = (EnumEntry *)((long)&(enums->name)._M_len + ~(ulong)pEVar4);
      }
      enums = pEVar4;
    } while (0 < (long)pEVar4);
  }
  if (((this == piVar1) || (__n = *(size_t *)this, __n != size)) ||
     ((__n != 0 && (iVar3 = bcmp(*(void **)(this + 8),(void *)name._M_len,__n), iVar3 != 0)))) {
    bVar2 = false;
  }
  else {
    *(undefined4 *)name._M_str = *(undefined4 *)(this + 0x10);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool LookUpEnumValue(const EnumEntry* enums, size_t size,
                     absl::string_view name, int* value) {
  EnumEntry target{name, 0};
  auto it = std::lower_bound(enums, enums + size, target, EnumCompareByName);
  if (it != enums + size && it->name == name) {
    *value = it->value;
    return true;
  }
  return false;
}